

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SingleVertexArrayFirstGroup::init
          (SingleVertexArrayFirstGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  int offset_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  bool bVar2;
  GLValue GVar3;
  GLValue GVar4;
  bool local_271;
  int local_270;
  int local_26c;
  int local_268;
  undefined1 local_258 [8];
  Spec spec;
  undefined4 uStack_21c;
  undefined1 local_210 [8];
  ArraySpec arraySpec;
  string local_1b0;
  string local_190;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string name;
  bool aligned;
  int alignment;
  int stride;
  int componentCount;
  int iStack_44;
  bool packed;
  int firstNdx;
  int strideNdx;
  int countNdx;
  int offsetNdx;
  int strides [3];
  int offsets [3];
  int firsts [2];
  int counts [2];
  SingleVertexArrayFirstGroup *this_local;
  
  firsts[0] = 5;
  firsts[1] = 0x100;
  offsets[1] = 6;
  offsets[2] = 0x18;
  strides[1] = 1;
  strides[2] = 0x10;
  offsets[0] = 0x11;
  _countNdx = 0x11ffffffff;
  iVar1 = 0x20;
  strides[0] = 0x20;
  strideNdx = 0;
  while (strideNdx < 3) {
    for (firstNdx = 0; firstNdx < 2; firstNdx = firstNdx + 1) {
      for (iStack_44 = 0; iStack_44 < 3; iStack_44 = iStack_44 + 1) {
        for (componentCount = 0; componentCount < 2; componentCount = componentCount + 1) {
          bVar2 = true;
          if (this->m_type != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            bVar2 = this->m_type == INPUTTYPE_INT_2_10_10_10;
          }
          iVar1 = 2;
          if (bVar2) {
            iVar1 = 4;
          }
          if ((&countNdx)[iStack_44] < 0) {
            if (bVar2) {
              local_268 = 8;
            }
            else {
              local_268 = deqp::gls::Array::inputTypeSize(this->m_type);
              local_268 = local_268 * iVar1;
            }
            local_26c = local_268;
          }
          else {
            local_26c = (&countNdx)[iStack_44];
          }
          if (bVar2) {
            local_270 = deqp::gls::Array::inputTypeSize(this->m_type);
            local_270 = local_270 * iVar1;
          }
          else {
            local_270 = deqp::gls::Array::inputTypeSize(this->m_type);
          }
          local_271 = false;
          if (local_26c % local_270 == 0) {
            local_271 = strides[(long)strideNdx + 1] % local_270 == 0;
          }
          name.field_2._M_local_buf[0xf] = local_271;
          typeToString<int>(&local_160,offsets[(long)componentCount + 1]);
          std::operator+(&local_140,"first",&local_160);
          std::operator+(&local_120,&local_140,"_offset");
          typeToString<int>(&local_190,strides[(long)strideNdx + 1]);
          std::operator+(&local_100,&local_120,&local_190);
          std::operator+(&local_e0,&local_100,"_stride");
          typeToString<int>(&local_1b0,local_26c);
          std::operator+(&local_c0,&local_e0,&local_1b0);
          std::operator+(&local_a0,&local_c0,"_quads");
          typeToString<int>((string *)&arraySpec.max.field_1.fl,firsts[firstNdx]);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arraySpec.max.field_1.fl);
          std::__cxx11::string::~string((string *)&arraySpec.max.field_1.fl);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          type = this->m_type;
          offset_ = strides[(long)strideNdx + 1];
          GVar3 = deqp::gls::GLValue::getMinValue(type);
          GVar4 = deqp::gls::GLValue::getMaxValue(this->m_type);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar4.type;
          max_._4_4_ = spec.arrays.
                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          max_.type = (InputType)
                      spec.arrays.
                      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          min_._4_4_ = uStack_21c;
          min_.type = GVar3.type;
          min_.field_1 = GVar3.field_1;
          max_.field_1 = GVar4.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_210,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                     iVar1,offset_,local_26c,false,min_,max_);
          deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_258);
          local_258._0_4_ = PRIMITIVE_TRIANGLES;
          local_258._4_4_ = firsts[firstNdx];
          spec.primitive = offsets[(long)componentCount + 1];
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       *)&spec.first,(value_type *)local_210);
          if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
            name_00 = (char *)std::__cxx11::string::c_str();
            desc = (char *)std::__cxx11::string::c_str();
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,testCtx,renderCtx,(Spec *)local_258,name_00,desc);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_258);
          std::__cxx11::string::~string((string *)local_80);
        }
      }
    }
    iVar1 = strideNdx + 1;
    strideNdx = iVar1;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayFirstGroup::init (void)
{
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 16, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	componentCount	= (packed) ? (4) : (2);
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (8) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
					std::string name			= "first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= firsts[firstNdx];
					spec.arrays.push_back(arraySpec);

					if (aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}